

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  const_reference bottom_blobs_00;
  const_reference top_blobs_00;
  reference opt_00;
  BinaryOp *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int elempack1;
  int elempack;
  Mat *top_blob;
  Mat *bottom_blob1;
  Mat *bottom_blob;
  Option *in_stack_00001c48;
  Mat *in_stack_00001c50;
  Mat *in_stack_00001c58;
  Mat *in_stack_00001c60;
  Option *in_stack_00002110;
  Mat *in_stack_00002118;
  Mat *in_stack_00002120;
  Mat *in_stack_00002128;
  Option *in_stack_00002b30;
  Mat *in_stack_00002b38;
  Mat *in_stack_00002b40;
  Mat *in_stack_00002b48;
  Option *in_stack_00002b50;
  Mat *in_stack_00002b58;
  Mat *in_stack_00002b60;
  Mat *in_stack_00002b68;
  
  bottom_blobs_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  top_blobs_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  opt_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  iVar2 = bottom_blobs_00->elempack;
  iVar1 = top_blobs_00->elempack;
  if ((iVar2 == 0x10) || (iVar1 == 0x10)) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                        (in_stack_00002b48,in_stack_00002b40,in_stack_00002b38,in_stack_00002b30);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 5) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 6) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 7) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8) {
      iVar2 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00002b68,in_stack_00002b60,in_stack_00002b58,in_stack_00002b50);
      return iVar2;
    }
  }
  if ((iVar2 == 8) || (iVar1 == 8)) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 5) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 6) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 7) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8) {
      iVar2 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00002128,in_stack_00002120,in_stack_00002118,in_stack_00002110);
      return iVar2;
    }
  }
  if ((iVar2 == 4) || (iVar1 == 4)) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 5) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 6) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 7) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8) {
      iVar2 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                        (in_stack_00001c60,in_stack_00001c58,in_stack_00001c50,in_stack_00001c48);
      return iVar2;
    }
  }
  iVar2 = BinaryOp::forward(in_RCX,(vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)bottom_blobs_00,
                            (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)top_blobs_00,
                            (Option *)opt_00);
  return iVar2;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_avx512_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}